

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilNam.c
# Opt level: O1

char * Abc_NamReportUnique(Vec_Int_t *vNameIds1,Abc_Nam_t *p1,Abc_Nam_t *p2)

{
  int NameId;
  char *pcVar1;
  int *piVar2;
  long lVar3;
  
  if (0 < vNameIds1->nSize) {
    lVar3 = 0;
    do {
      NameId = vNameIds1->pArray[lVar3];
      if ((NameId < 1) || ((p1->vInt2Handle).nSize <= NameId)) {
        __assert_fail("Entry > 0 && Entry < Abc_NamObjNumMax(p1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilNam.c"
                      ,0x261,"char *Abc_NamReportUnique(Vec_Int_t *, Abc_Nam_t *, Abc_Nam_t *)");
      }
      pcVar1 = Abc_NamStr(p1,NameId);
      piVar2 = Abc_NamStrHashFind(p2,pcVar1,(char *)0x0);
      if (*piVar2 == 0) {
        pcVar1 = Abc_NamStr(p1,NameId);
        return pcVar1;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 < vNameIds1->nSize);
  }
  return (char *)0x0;
}

Assistant:

char * Abc_NamReportUnique( Vec_Int_t * vNameIds1, Abc_Nam_t * p1, Abc_Nam_t * p2 )
{
    int i, Entry;
    Vec_IntForEachEntry( vNameIds1, Entry, i )
    {
        assert( Entry > 0 && Entry < Abc_NamObjNumMax(p1) );
        if ( Abc_NamStrFind(p2, Abc_NamStr(p1, Entry)) == 0 )
            return Abc_NamStr(p1, Entry);
    }
    return NULL;
}